

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::basic_json_parser
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,
          basic_json_decode_options<wchar_t> *options,
          function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *temp_alloc)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  basic_json_decode_options<wchar_t> *in_RSI;
  ser_context *in_RDI;
  size_t initial_stack_capacity;
  undefined7 in_stack_fffffffffffffe88;
  parse_state in_stack_fffffffffffffe8f;
  basic_json_parser<wchar_t,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  ser_context *__args_1;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  chars_to *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 uVar5;
  int in_stack_fffffffffffffec0;
  wstring local_a8 [32];
  double local_88;
  wstring local_80 [32];
  double local_60;
  wstring local_58 [32];
  long local_38;
  allocator<wchar_t> local_2d [29];
  basic_json_decode_options<wchar_t> *local_10;
  
  local_10 = in_RSI;
  ser_context::ser_context(in_RDI);
  in_RDI->_vptr_ser_context = (_func_int **)&PTR__basic_json_parser_0133dcf8;
  iVar3 = basic_json_options_common<wchar_t>::max_nesting_depth
                    ((basic_json_options_common<wchar_t> *)
                     ((long)&local_10->_vptr_basic_json_decode_options +
                     (long)local_10->_vptr_basic_json_decode_options[-3]));
  *(int *)&in_RDI[1]._vptr_ser_context = iVar3;
  bVar1 = basic_json_decode_options<wchar_t>::allow_trailing_comma(local_10);
  *(bool *)((long)&in_RDI[1]._vptr_ser_context + 4) = bVar1;
  bVar1 = basic_json_decode_options<wchar_t>::allow_comments(local_10);
  *(bool *)((long)&in_RDI[1]._vptr_ser_context + 5) = bVar1;
  bVar1 = basic_json_decode_options<wchar_t>::lossless_number(local_10);
  *(bool *)((long)&in_RDI[1]._vptr_ser_context + 6) = bVar1;
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)
             in_stack_fffffffffffffea0,
             (function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)
             CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  *(undefined4 *)&in_RDI[6]._vptr_ser_context = 0;
  *(undefined4 *)((long)&in_RDI[6]._vptr_ser_context + 4) = 0;
  *(undefined4 *)&in_RDI[7]._vptr_ser_context = 0;
  in_RDI[8]._vptr_ser_context = (_func_int **)0x1;
  in_RDI[9]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[10]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0xb]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0xc]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0xd]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0xe]._vptr_ser_context = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0xf]._vptr_ser_context = 1;
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ser_context + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ser_context + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ser_context + 3) = 1;
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ser_context + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ser_context + 5) = 0;
  *(undefined4 *)&in_RDI[0x10]._vptr_ser_context = 0;
  std::allocator<wchar_t>::allocator<char>
            ((allocator<wchar_t> *)in_stack_fffffffffffffe90,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x11),(allocator *)local_2d);
  std::allocator<wchar_t>::~allocator(local_2d);
  detail::chars_to::chars_to(in_stack_fffffffffffffea0);
  std::allocator<jsoncons::parse_state>::allocator<char>
            ((allocator<jsoncons::parse_state> *)in_stack_fffffffffffffe90,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  std::vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>::vector
            ((vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_> *)
             in_stack_fffffffffffffe90,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  std::allocator<jsoncons::parse_state>::~allocator((allocator<jsoncons::parse_state> *)0x60547d);
  std::
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
            *)0x605496);
  std::__cxx11::wstring::reserve((ulong)(in_RDI + 0x11));
  iVar3 = basic_json_options_common<wchar_t>::max_nesting_depth
                    ((basic_json_options_common<wchar_t> *)
                     ((long)&local_10->_vptr_basic_json_decode_options +
                     (long)local_10->_vptr_basic_json_decode_options[-3]));
  if (iVar3 < 0x41) {
    in_stack_fffffffffffffec0 =
         basic_json_options_common<wchar_t>::max_nesting_depth
                   ((basic_json_options_common<wchar_t> *)
                    ((long)&local_10->_vptr_basic_json_decode_options +
                    (long)local_10->_vptr_basic_json_decode_options[-3]));
    iVar4 = in_stack_fffffffffffffec0 + 2;
  }
  else {
    iVar4 = 0x42;
  }
  local_38 = (long)iVar4;
  std::vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>::reserve
            ((vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffec0),CONCAT44(iVar4,in_stack_fffffffffffffeb8));
  push_state(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f);
  bVar1 = basic_json_options_common<wchar_t>::enable_str_to_nan
                    ((basic_json_options_common<wchar_t> *)
                     ((long)&local_10->_vptr_basic_json_decode_options +
                     (long)local_10->_vptr_basic_json_decode_options[-3]));
  uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeb8);
  if (bVar1) {
    basic_json_options_common<wchar_t>::nan_to_str_abi_cxx11_
              ((basic_json_options_common<wchar_t> *)
               CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    local_60 = nan("");
    std::
    vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
    ::emplace_back<std::__cxx11::wstring,double>
              ((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
                *)in_stack_fffffffffffffea0,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
               (double *)in_stack_fffffffffffffe90);
    std::__cxx11::wstring::~wstring(local_58);
  }
  bVar1 = basic_json_options_common<wchar_t>::enable_str_to_inf
                    ((basic_json_options_common<wchar_t> *)
                     ((long)&local_10->_vptr_basic_json_decode_options +
                     (long)local_10->_vptr_basic_json_decode_options[-3]));
  if (bVar1) {
    in_stack_fffffffffffffea0 = (chars_to *)(in_RDI + 0x1c);
    basic_json_options_common<wchar_t>::inf_to_str_abi_cxx11_
              ((basic_json_options_common<wchar_t> *)
               CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    local_88 = std::numeric_limits<double>::infinity();
    std::
    vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
    ::emplace_back<std::__cxx11::wstring,double>
              ((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
                *)in_stack_fffffffffffffea0,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
               (double *)in_stack_fffffffffffffe90);
    std::__cxx11::wstring::~wstring(local_80);
  }
  uVar2 = basic_json_options_common<wchar_t>::enable_str_to_neginf
                    ((basic_json_options_common<wchar_t> *)
                     ((long)&local_10->_vptr_basic_json_decode_options +
                     (long)local_10->_vptr_basic_json_decode_options[-3]));
  if ((bool)uVar2) {
    __args_1 = in_RDI + 0x1c;
    basic_json_options_common<wchar_t>::neginf_to_str_abi_cxx11_
              ((basic_json_options_common<wchar_t> *)CONCAT44(iVar4,uVar5));
    std::numeric_limits<double>::infinity();
    std::
    vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
    ::emplace_back<std::__cxx11::wstring,double>
              ((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
                *)in_stack_fffffffffffffea0,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffe98),(double *)__args_1);
    std::__cxx11::wstring::~wstring(local_a8);
  }
  return;
}

Assistant:

basic_json_parser(const basic_json_decode_options<char_type>& options,
                      std::function<bool(json_errc,const ser_context&)> err_handler, 
                      const TempAllocator& temp_alloc = TempAllocator())
       : max_nesting_depth_(options.max_nesting_depth()),
         allow_trailing_comma_(options.allow_trailing_comma()),
         allow_comments_(options.allow_comments()),
         lossless_number_(options.lossless_number()),
         err_handler_(err_handler),
         string_buffer_(temp_alloc),
         state_stack_(temp_alloc)
    {
        string_buffer_.reserve(initial_string_buffer_capacity);

        std::size_t initial_stack_capacity = options.max_nesting_depth() <= (default_initial_stack_capacity-2) ? (options.max_nesting_depth()+2) : default_initial_stack_capacity;
        state_stack_.reserve(initial_stack_capacity );
        push_state(parse_state::root);

        if (options.enable_str_to_nan())
        {
            string_double_map_.emplace_back(options.nan_to_str(),std::nan(""));
        }
        if (options.enable_str_to_inf())
        {
            string_double_map_.emplace_back(options.inf_to_str(),std::numeric_limits<double>::infinity());
        }
        if (options.enable_str_to_neginf())
        {
            string_double_map_.emplace_back(options.neginf_to_str(),-std::numeric_limits<double>::infinity());
        }
    }